

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O1

int mmk_streq(char *src,char *ref)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *src;
  if (cVar1 != '\0') {
    pcVar2 = src + 1;
    do {
      if (*ref == '\0') break;
      if (cVar1 != *ref) {
        return 0;
      }
      ref = ref + 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return (int)(*ref == cVar1);
}

Assistant:

int mmk_streq(const char *src, const char *ref)
{
    for (; *src && *ref; ++src, ++ref) {
        if (*src != *ref)
            return 0;
    }
    return *ref == *src;
}